

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  cmState *this_00;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  this_00 = cmMakefile::GetState(mf);
  pcVar2 = cmState::GetBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
  cmLocalCommonGenerator::cmLocalCommonGenerator
            (&this->super_cmLocalCommonGenerator,gg,mf,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_0067c060;
  (this->HomeRelativeOutputPath)._M_dataplus._M_p = (pointer)&(this->HomeRelativeOutputPath).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->HomeRelativeOutputPath,"");
  p_Var1 = &(this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf, mf->GetState()->GetBinaryDirectory())
  , HomeRelativeOutputPath("")
{
}